

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void send_ssi_file(mg_connection *conn,char *path,FILE *fp,int include_level)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  size_t sVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  ns_connection *nc;
  bool bVar9;
  char buf [8192];
  char file_name [8192];
  char *local_6048;
  int local_603c;
  int local_6038;
  char local_6034;
  undefined4 local_6033;
  undefined3 local_602f;
  undefined1 local_602c [8180];
  char local_4038 [8192];
  undefined1 local_2038 [8200];
  
  if (10 < include_level) {
    mg_printf(conn,"SSI #include level is too deep (%s)",path);
    return;
  }
  iVar2 = fgetc((FILE *)fp);
  if (iVar2 != -1) {
    local_603c = include_level + 1;
    bVar9 = false;
    sVar7 = 0;
    local_6048 = path;
    do {
      iVar8 = (int)sVar7;
      if (iVar2 == 0x3e && bVar9) {
        *(undefined2 *)((long)&local_6038 + (long)iVar8) = 0x3e;
        if (0x1fff < iVar8) {
          __assert_fail("len <= (int) sizeof(buf)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                        ,0x105b,
                        "void send_ssi_file(struct mg_connection *, const char *, FILE *, int)");
        }
        if ((iVar8 < 5) || (local_6034 != '#' || local_6038 != 0x2d2d213c)) {
          sVar7 = (long)iVar8 + 1;
          nc = (ns_connection *)conn[-1].callback_param;
LAB_0010ad87:
          ns_out(nc,&local_6038,sVar7);
        }
        else if (CONCAT31(local_602f,local_6033._3_1_) == 0x6564756c && local_6033 == 0x6c636e69) {
          pcVar6 = conn[1].request_method;
          iVar2 = __isoc99_sscanf(local_602c," virtual=\"%[^\"]\"",local_2038);
          if (iVar2 == 1) {
            mg_snprintf(local_4038,0x2000,"%s%c%s",*(undefined8 *)(pcVar6 + 0x68),0x2f,local_2038);
          }
          else {
            iVar2 = __isoc99_sscanf(local_602c," abspath=\"%[^\"]\"",local_2038);
            if (iVar2 == 1) {
              sVar7 = 0x2000;
              ppcVar1 = &local_6048;
            }
            else {
              iVar2 = __isoc99_sscanf(local_602c," file=\"%[^\"]\"",local_2038);
              if ((iVar2 != 1) &&
                 (iVar2 = __isoc99_sscanf(local_602c," \"%[^\"]\"",local_2038), iVar2 != 1)) {
                mg_printf(conn,"Bad SSI #include: [%s]",local_602c);
                goto LAB_0010ad91;
              }
              mg_snprintf(local_4038,0x2000,"%s",local_6048);
              pcVar3 = strrchr(local_4038,0x2f);
              if (pcVar3 != (char *)0x0) {
                pcVar3[1] = '\0';
              }
              sVar4 = strlen(local_4038);
              ppcVar1 = (char **)((long)&local_6048 + sVar4);
              sVar7 = 0x2000 - sVar4;
            }
            mg_snprintf((char *)((long)ppcVar1 + 0x2010),sVar7,"%s",local_2038);
          }
          __stream = fopen64(local_4038,"rb");
          if (__stream == (FILE *)0x0) {
            piVar5 = __errno_location();
            pcVar6 = strerror(*piVar5);
            mg_printf(conn,"Cannot open SSI #include: [%s]: fopen(%s): %s",local_602c,local_4038,
                      pcVar6);
          }
          else {
            iVar2 = fileno(__stream);
            fcntl64(iVar2,2,1);
            pcVar6 = *(char **)(pcVar6 + 0xb8);
            sVar4 = strlen(pcVar6);
            iVar2 = mg_match_prefix(pcVar6,(int)sVar4,local_4038);
            if (iVar2 < 1) {
              send_file_data(conn,(FILE *)__stream);
            }
            else {
              send_ssi_file(conn,local_4038,(FILE *)__stream,local_603c);
            }
            fclose(__stream);
          }
        }
        else if (local_6033 == 0x63657865) {
          do_ssi_exec(conn,(char *)&local_602f);
        }
        else {
          mg_printf(conn,"%s: unknown SSI command: \"%s\"",local_6048,&local_6038);
        }
LAB_0010ad91:
        sVar7 = 0;
        bVar9 = false;
      }
      else if (bVar9) {
        bVar9 = true;
        if (iVar8 == 0x1ffe) {
          iVar8 = 0;
          mg_printf(conn,"%s: SSI tag is too large",local_6048);
        }
        else if (iVar8 == 5) {
          bVar9 = local_6034 == '#' && local_6038 == 0x2d2d213c;
          iVar8 = 5;
        }
        sVar7 = (size_t)(iVar8 + 1);
        *(char *)((long)&local_6038 + (long)iVar8) = (char)iVar2;
      }
      else if (iVar2 == 0x3c) {
        if (0 < iVar8) {
          ns_out((ns_connection *)conn[-1].callback_param,&local_6038,sVar7);
        }
        local_6038 = CONCAT31(local_6038._1_3_,0x3c);
        sVar7 = 1;
        bVar9 = true;
      }
      else {
        sVar7 = (size_t)(iVar8 + 1U);
        *(char *)((long)&local_6038 + (long)iVar8) = (char)iVar2;
        bVar9 = false;
        if (iVar8 + 1U == 0x2000) {
          nc = (ns_connection *)conn[-1].callback_param;
          sVar7 = 0x2000;
          goto LAB_0010ad87;
        }
      }
      iVar2 = fgetc((FILE *)fp);
    } while (iVar2 != -1);
    if (0 < (int)sVar7) {
      ns_out((ns_connection *)conn[-1].callback_param,&local_6038,sVar7);
    }
  }
  return;
}

Assistant:

static void send_ssi_file(struct mg_connection *conn, const char *path,
                          FILE *fp, int include_level) {
  char buf[IOBUF_SIZE];
  int ch, offset, len, in_ssi_tag;

  if (include_level > 10) {
    mg_printf(conn, "SSI #include level is too deep (%s)", path);
    return;
  }

  in_ssi_tag = len = offset = 0;
  while ((ch = fgetc(fp)) != EOF) {
    if (in_ssi_tag && ch == '>') {
      in_ssi_tag = 0;
      buf[len++] = (char) ch;
      buf[len] = '\0';
      assert(len <= (int) sizeof(buf));
      if (len < 6 || memcmp(buf, "<!--#", 5) != 0) {
        // Not an SSI tag, pass it
        (void) mg_write(conn, buf, (size_t) len);
      } else {
        if (!memcmp(buf + 5, "include", 7)) {
          do_ssi_include(conn, path, buf + 12, include_level);
#if !defined(MONGOOSE_NO_POPEN)
        } else if (!memcmp(buf + 5, "exec", 4)) {
          do_ssi_exec(conn, buf + 9);
#endif // !NO_POPEN
        } else {
          mg_printf(conn, "%s: unknown SSI " "command: \"%s\"", path, buf);
        }
      }
      len = 0;
    } else if (in_ssi_tag) {
      if (len == 5 && memcmp(buf, "<!--#", 5) != 0) {
        // Not an SSI tag
        in_ssi_tag = 0;
      } else if (len == (int) sizeof(buf) - 2) {
        mg_printf(conn, "%s: SSI tag is too large", path);
        len = 0;
      }
      buf[len++] = ch & 0xff;
    } else if (ch == '<') {
      in_ssi_tag = 1;
      if (len > 0) {
        mg_write(conn, buf, (size_t) len);
      }
      len = 0;
      buf[len++] = ch & 0xff;
    } else {
      buf[len++] = ch & 0xff;
      if (len == (int) sizeof(buf)) {
        mg_write(conn, buf, (size_t) len);
        len = 0;
      }
    }
  }

  // Send the rest of buffered data
  if (len > 0) {
    mg_write(conn, buf, (size_t) len);
  }
}